

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# motion_search_facade.c
# Opt level: O3

int compare_weight(void *a,void *b)

{
  int iVar1;
  
  iVar1 = 1;
  if (*(int *)((long)b + 4) <= *(int *)((long)a + 4)) {
    iVar1 = -(uint)(*(int *)((long)a + 4) != *(int *)((long)b + 4));
  }
  return iVar1;
}

Assistant:

static int compare_weight(const void *a, const void *b) {
  const int diff = ((cand_mv_t *)a)->weight - ((cand_mv_t *)b)->weight;
  if (diff < 0)
    return 1;
  else if (diff > 0)
    return -1;
  return 0;
}